

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Vta_ManSatVerify(Vta_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vta_Obj_t *pVVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  Vta_Obj_t *pThis0;
  Vta_Obj_t *pThis1;
  Vta_Obj_t *local_40;
  Vta_Obj_t *local_38;
  
  if (1 < p->nObjs) {
    lVar8 = 1;
    lVar11 = 0x1c;
    do {
      if (p->pSat->size <= lVar8) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.h"
                      ,0xd4,"int sat_solver2_var_value(sat_solver2 *, int)");
      }
      *(uint *)((long)&p->pObjs->iObj + lVar11) =
           (*(uint *)((long)&p->pObjs->iObj + lVar11) & 0xcfffffff) +
           (uint)(p->pSat->model[lVar8] == 1) * 0x10000000 + 0x10000000;
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar8 < p->nObjs);
  }
  if (1 < p->nObjs) {
    lVar11 = 1;
    lVar8 = 0x10;
    do {
      pVVar3 = p->pObjs;
      iVar1 = *(int *)((long)&pVVar3->iObj + lVar8);
      if (((long)iVar1 < 0) || (p->pGia->nObjs <= iVar1)) {
LAB_0059ce21:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pGia->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        return;
      }
      if (((&pVVar3->field_0xf)[lVar8] & 0x40) != 0) {
        pGVar4 = pGVar4 + iVar1;
        Vta_ObjPreds(p,(Vta_Obj_t *)((long)&pVVar3->iObj + lVar8),pGVar4,&local_40,&local_38);
        uVar5 = *(ulong *)pGVar4;
        uVar7 = (uint)uVar5;
        if ((~uVar7 & 0x1fffffff) == 0 || (int)uVar7 < 0) {
          if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
            pGVar6 = p->pGia;
            uVar7 = (uint)(uVar5 >> 0x20);
            if (pGVar6->vCis->nSize - pGVar6->nRegs <= (int)(uVar7 & 0x1fffffff)) {
              uVar7 = uVar7 & 0x1fffffff;
              iVar1 = pGVar6->vCis->nSize;
              if ((int)uVar7 < iVar1 - pGVar6->nRegs) {
                __assert_fail("Gia_ObjIsRo(p, pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
              }
              iVar2 = pGVar6->vCos->nSize;
              uVar7 = (iVar2 - iVar1) + uVar7;
              if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar1 = pGVar6->vCos->pArray[uVar7];
              lVar9 = (long)iVar1;
              if ((lVar9 < 0) || (pGVar6->nObjs <= iVar1)) goto LAB_0059ce21;
              if (*(int *)((long)&pVVar3->iFrame + lVar8) == 0) {
                if ((*(uint *)(&pVVar3->field_0xc + lVar8) & 0x30000000) != 0x10000000) {
                  __assert_fail("pThis->Value == VTA_VAR0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                                ,0x218,"void Vta_ManSatVerify(Vta_Man_t *)");
                }
              }
              else {
                uVar7 = *(uint *)(&pVVar3->field_0xc + lVar8) >> 0x1c & 3;
                if (uVar7 == 2) {
                  if ((*(uint *)&local_40->field_0xc >> 0x1c & 3) !=
                      ((pGVar6->pObjs[lVar9].field_0x3 & 0x20) == 0) + 1) {
                    __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                                  ,0x21c,"void Vta_ManSatVerify(Vta_Man_t *)");
                  }
                }
                else {
                  if (uVar7 != 1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                                  ,0x21d,"void Vta_ManSatVerify(Vta_Man_t *)");
                  }
                  if ((*(uint *)&local_40->field_0xc >> 0x1c & 3) !=
                      2 - ((pGVar6->pObjs[lVar9].field_0x3 & 0x20) == 0)) {
                    __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                                  ,0x21a,"void Vta_ManSatVerify(Vta_Man_t *)");
                  }
                }
              }
            }
          }
        }
        else {
          uVar10 = *(uint *)(&pVVar3->field_0xc + lVar8) >> 0x1c & 3;
          if (uVar10 == 1) {
            if (((*(uint *)&local_40->field_0xc >> 0x1c & 3) != ((uVar7 >> 0x1d & 1) != 0) + 1) &&
               ((*(uint *)&local_38->field_0xc >> 0x1c & 3) !=
                2 - ((uVar5 & 0x2000000000000000) == 0))) {
              __assert_fail("Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                            ,0x211,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
          }
          else {
            if (uVar10 != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                            ,0x212,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
            if (((*(uint *)&local_40->field_0xc >> 0x1c & 3) != 2 - ((uVar7 >> 0x1d & 1) != 0)) ||
               ((*(uint *)&local_38->field_0xc >> 0x1c & 3) !=
                ((uVar5 & 0x2000000000000000) == 0) + 1)) {
              __assert_fail("Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj))"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absVta.c"
                            ,0x20f,"void Vta_ManSatVerify(Vta_Man_t *)");
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar11 < p->nObjs);
  }
  return;
}

Assistant:

void Vta_ManSatVerify( Vta_Man_t * p )
{
    Vta_Obj_t * pThis, * pThis0, * pThis1;
    Gia_Obj_t * pObj;
    int i;
    Vta_ManForEachObj( p, pThis, i )
        pThis->Value = (sat_solver2_var_value(p->pSat, i) ? VTA_VAR1 : VTA_VAR0);
    Vta_ManForEachObjObj( p, pThis, pObj, i )
    {
        if ( !pThis->fAdded )
            continue;
        Vta_ObjPreds( p, pThis, pObj, &pThis0, &pThis1 );
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) && Vta_ValIs1(pThis1, Gia_ObjFaninC1(pObj)) );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) || Vta_ValIs0(pThis1, Gia_ObjFaninC1(pObj)) );
            else assert( 0 );
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            if ( pThis->iFrame == 0 )
                assert( pThis->Value == VTA_VAR0 );
            else if ( pThis->Value == VTA_VAR0 )
                assert( Vta_ValIs0(pThis0, Gia_ObjFaninC0(pObj)) );
            else if ( pThis->Value == VTA_VAR1 )
                assert( Vta_ValIs1(pThis0, Gia_ObjFaninC0(pObj)) );
            else assert( 0 );
        }
    }
}